

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

void preconditioner_to_regularizer<dense_parameters>
               (vw *all,bfgs *b,float regularization,dense_parameters *weights)

{
  float fVar1;
  weight *pwVar2;
  uint32_t uVar3;
  float *pfVar4;
  vw_exception *this;
  long lVar5;
  ulong uVar6;
  stringstream __msg;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190;
  
  if (b->regularizers == (weight *)0x0) {
    pfVar4 = calloc_or_throw<float>((ulong)(uint)(2 << ((byte)all->num_bits & 0x1f)));
    b->regularizers = pfVar4;
    if (pfVar4 == (float *)0x0) {
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_190,"Failed to allocate weight array: try decreasing -b <bits>",0x39);
      this = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/bfgs.cc"
                 ,0x21a,&local_1c0);
      __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    pwVar2 = weights->_begin;
    if (pwVar2 != pwVar2 + weights->_weight_mask + 1) {
      uVar3 = weights->_stride_shift;
      lVar5 = 0;
      do {
        uVar6 = (ulong)(lVar5 >> 2) >> ((byte)weights->_stride_shift & 0x3f);
        b->regularizers[uVar6 * 2] = regularization;
        fVar1 = *(float *)((long)pwVar2 + lVar5 + 0xc);
        if (0.0 < fVar1) {
          b->regularizers[uVar6 * 2] = 1.0 / fVar1 + b->regularizers[uVar6 * 2];
        }
        lVar5 = lVar5 + (1L << ((byte)uVar3 & 0x3f)) * 4;
      } while ((weight *)((long)pwVar2 + lVar5) != weights->_begin + weights->_weight_mask + 1);
    }
  }
  else {
    pwVar2 = weights->_begin;
    if (pwVar2 != pwVar2 + weights->_weight_mask + 1) {
      uVar3 = weights->_stride_shift;
      lVar5 = 0;
      do {
        fVar1 = *(float *)((long)pwVar2 + lVar5 + 0xc);
        if (0.0 < fVar1) {
          uVar6 = (ulong)(lVar5 >> 2) >> ((byte)weights->_stride_shift & 0x3f);
          b->regularizers[uVar6 * 2] = 1.0 / fVar1 + b->regularizers[uVar6 * 2];
        }
        lVar5 = lVar5 + (1L << ((byte)uVar3 & 0x3f)) * 4;
      } while ((weight *)((long)pwVar2 + lVar5) != weights->_begin + weights->_weight_mask + 1);
    }
  }
  pwVar2 = weights->_begin;
  if (pwVar2 != pwVar2 + weights->_weight_mask + 1) {
    uVar3 = weights->_stride_shift;
    lVar5 = 0;
    do {
      b->regularizers[((ulong)(lVar5 >> 2) >> ((byte)weights->_stride_shift & 0x3f)) * 2 + 1] =
           *(weight *)((long)pwVar2 + lVar5);
      lVar5 = lVar5 + (1L << ((byte)uVar3 & 0x3f)) * 4;
    } while ((weight *)((long)pwVar2 + lVar5) != weights->_begin + weights->_weight_mask + 1);
  }
  return;
}

Assistant:

void preconditioner_to_regularizer(vw& all, bfgs& b, float regularization, T& weights)
{
  uint32_t length = 1 << all.num_bits;

  if (b.regularizers == nullptr)
  {
    b.regularizers = calloc_or_throw<weight>(2 * length);

    if (b.regularizers == nullptr)
      THROW("Failed to allocate weight array: try decreasing -b <bits>");

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      b.regularizers[2 * i] = regularization;
      if ((&(*w))[W_COND] > 0.f)
        b.regularizers[2 * i] += 1.f / (&(*w))[W_COND];
    }
  }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      if ((&(*w))[W_COND] > 0.f)
        b.regularizers[2 * (w.index() >> weights.stride_shift())] += 1.f / (&(*w))[W_COND];
    }

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    b.regularizers[2 * (w.index() >> weights.stride_shift()) + 1] = *w;
}